

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O3

PCRE2_SPTR16 get_chr_property_list(PCRE2_SPTR16 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  ushort *puVar1;
  ushort *puVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  undefined4 uVar4;
  ushort uVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  
  uVar7 = *code;
  uVar3 = (uint)uVar7;
  *(uint *)fcc = (uint)uVar7;
  fcc[4] = '\0';
  fcc[5] = '\0';
  fcc[6] = '\0';
  fcc[7] = '\0';
  puVar1 = code + 1;
  if ((ushort)(uVar7 - 0x21) < 0x41) {
    uVar5 = 0x55;
    if ((((uVar7 < 0x55) && (uVar5 = 0x48, uVar7 < 0x48)) && (uVar5 = 0x3b, uVar7 < 0x3b)) &&
       (uVar5 = 0x2e, uVar7 < 0x2e)) {
      uVar5 = 0x21;
    }
    uVar6 = ((uint)uVar7 - (uint)uVar5) + 0x21;
    uVar8 = (ulong)(uVar6 & 0xffff);
    uVar7 = (ushort)uVar6;
    if ((uVar7 < 0x2e) && ((0x238000000000U >> (uVar8 & 0x3f) & 1) != 0)) {
      puVar1 = code + 2;
    }
    if ((0x29 < uVar7) || (uVar6 = 0, (0x21800000000U >> (uVar8 & 0x3f) & 1) == 0)) {
      uVar6 = (uint)(uVar7 != 0x2b);
    }
    *(uint *)(fcc + 4) = uVar6;
    if (uVar5 < 0x3b) {
      uVar4 = 0x1d;
      if (uVar5 == 0x21) {
LAB_0013b62c:
        *(undefined4 *)fcc = uVar4;
        goto switchD_0013b652_caseD_1d;
      }
      if (uVar5 == 0x2e) goto LAB_0013b66c;
      goto LAB_0013b639;
    }
    if (uVar5 == 0x55) {
      uVar3 = (uint)*puVar1;
      *(uint *)fcc = (uint)*puVar1;
      puVar1 = puVar1 + 1;
      goto LAB_0013b639;
    }
    if (uVar5 != 0x48) {
      if (uVar5 == 0x3b) {
        uVar4 = 0x1f;
        goto LAB_0013b62c;
      }
      goto LAB_0013b639;
    }
switchD_0013b652_caseD_20:
    uVar4 = 0x1f;
LAB_0013b66c:
    *(undefined4 *)fcc = uVar4;
    uVar7 = *puVar1;
    *(uint *)(fcc + 8) = (uint)uVar7;
    if ((uVar7 < 0x100) &&
       (uVar3 = (uint)*(byte *)(CONCAT44(in_register_00000034,utf) + (ulong)(uint)uVar7),
       *(uint *)(fcc + 0xc) = uVar3, uVar3 != uVar7)) {
      fcc[0x10] = 0xff;
      fcc[0x11] = 0xff;
      fcc[0x12] = 0xff;
      fcc[0x13] = 0xff;
      return puVar1 + 1;
    }
    fcc[0xc] = 0xff;
    fcc[0xd] = 0xff;
    fcc[0xe] = 0xff;
    fcc[0xf] = 0xff;
    return puVar1 + 1;
  }
LAB_0013b639:
  switch(uVar3) {
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    return puVar1;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x1b:
  case 0x1c:
    return (PCRE2_SPTR16)0x0;
  case 0x1d:
  case 0x1f:
switchD_0013b652_caseD_1d:
    *(uint *)(fcc + 8) = (uint)*puVar1;
    fcc[0xc] = 0xff;
    fcc[0xd] = 0xff;
    fcc[0xe] = 0xff;
    fcc[0xf] = 0xff;
    return puVar1 + 1;
  case 0x1e:
    uVar4 = 0x1d;
    goto LAB_0013b66c;
  case 0x20:
    goto switchD_0013b652_caseD_20;
  default:
    if (uVar3 - 0x6e < 2) {
      puVar2 = puVar1 + 0x10;
    }
    else {
      if (uVar3 != 0x70) {
        return (PCRE2_SPTR16)0x0;
      }
      puVar2 = puVar1 + ((ulong)*puVar1 - 1);
    }
    uVar3 = *puVar2 - 0x62;
    if (uVar3 < 0xc) {
      if ((0x533U >> (uVar3 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar3 & 0x1f) & 1) == 0) {
          *(uint *)(fcc + 4) = (uint)(puVar2[1] == 0);
          puVar2 = puVar2 + 3;
          goto LAB_0013b70b;
        }
      }
      else {
        fcc[4] = '\x01';
        fcc[5] = '\0';
        fcc[6] = '\0';
        fcc[7] = '\0';
      }
      puVar2 = puVar2 + 1;
    }
LAB_0013b70b:
    *(int *)(fcc + 8) = (int)((ulong)((long)puVar2 - (long)puVar1) >> 1);
    return puVar2;
  }
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}